

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.h
# Opt level: O3

ZyanStatus
ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *buffer,ZydisPredefinedToken *data)

{
  void **ppvVar1;
  ZyanUSize ZVar2;
  void *pvVar3;
  ZyanStatus ZVar4;
  long lVar5;
  ulong uVar6;
  
  if (data == (ZydisPredefinedToken *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                  ,0xe4,
                  "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                 );
  }
  ZVar2 = (buffer->string).vector.size;
  if (ZVar2 - 1 < 0xff) {
    ZVar4 = 0x80100009;
    if (data->size + ZVar2 < buffer->capacity) {
      pvVar3 = (buffer->string).vector.data;
      *(char *)((long)pvVar3 + -1) = (char)ZVar2;
      memcpy((void *)((long)pvVar3 + ZVar2),data + 1,(ulong)data->size);
      lVar5 = data->next + ZVar2;
      uVar6 = buffer->capacity - lVar5;
      buffer->capacity = uVar6;
      ppvVar1 = &(buffer->string).vector.data;
      *ppvVar1 = (void *)((long)*ppvVar1 + lVar5);
      (buffer->string).vector.size = (ulong)data->size - (ulong)data->next;
      if (0xfe < uVar6) {
        uVar6 = 0xff;
      }
      (buffer->string).vector.capacity = uVar6;
      ZVar4 = 0x100000;
    }
    return ZVar4;
  }
  __assert_fail("(len > 0) && (len < 256)",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                ,0xe7,
                "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
               );
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer* buffer,
    const ZydisPredefinedToken* data)
{
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(data);

    const ZyanUSize len = buffer->string.vector.size;
    ZYAN_ASSERT((len > 0) && (len < 256));
    if (buffer->capacity <= len + data->size)
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZydisFormatterToken* const last = (ZydisFormatterToken*)buffer->string.vector.data - 1;
    last->next = (ZyanU8)len;

    ZYAN_MEMCPY((ZyanU8*)buffer->string.vector.data + len, &data->data[0], data->size);

    const ZyanUSize delta = len + data->next;
    buffer->capacity -= delta;
    buffer->string.vector.data = (ZyanU8*)buffer->string.vector.data + delta;
    buffer->string.vector.size = data->size - data->next;
    buffer->string.vector.capacity = ZYAN_MIN(buffer->capacity, 255);

    return ZYAN_STATUS_SUCCESS;
}